

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void shiftChar(void)

{
  size_t *psVar1;
  Expansion *__ptr;
  int iVar2;
  LexerState *pLVar3;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  Expansion *exp;
  
  pLVar3 = lexerState;
  if (lexerState->capturing == true) {
    if (lexerState->captureBuf != (char *)0x0) {
      if (lexerState->captureCapacity <= lexerState->captureSize + 1) {
        reallocCaptureBuf();
      }
      iVar2 = peek();
      lexerState->captureBuf[lexerState->captureSize] = (char)iVar2;
    }
    pLVar3 = lexerState;
    lexerState->captureSize = lexerState->captureSize + 1;
  }
  pLVar3->macroArgScanDistance = pLVar3->macroArgScanDistance - 1;
  while (__ptr = pLVar3->expansions, __ptr != (Expansion *)0x0) {
    if (__ptr->size < __ptr->offset) {
      __assert_fail("lexerState->expansions->offset <= lexerState->expansions->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x3a6,"shiftChar");
    }
    uVar5 = __ptr->offset + 1;
    __ptr->offset = uVar5;
    if (uVar5 <= __ptr->size) {
      return;
    }
    pLVar3->expansions = __ptr->parent;
    free(__ptr->name);
    if (__ptr->owned == true) {
      free((__ptr->contents).unowned);
    }
    free(__ptr);
    pLVar3 = lexerState;
  }
  pLVar3->colNo = pLVar3->colNo + 1;
  if (pLVar3->isMmapped == true) {
    psVar1 = &(pLVar3->field_2).field_0.offset;
    *psVar1 = *psVar1 + 1;
  }
  else {
    uVar5 = (pLVar3->field_2).field_0.size;
    if (0x29 < uVar5) {
      __assert_fail("lexerState->index < LEXER_BUF_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x3b7,"shiftChar");
    }
    sVar4 = uVar5 + 1;
    sVar6 = 0;
    if (sVar4 != 0x2a) {
      sVar6 = sVar4;
    }
    (pLVar3->field_2).field_0.size = sVar6;
    sVar6 = (pLVar3->field_2).field_1.nbChars;
    if (sVar6 == 0) {
      __assert_fail("lexerState->nbChars > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                    ,0x3bb,"shiftChar");
    }
    (pLVar3->field_2).field_1.nbChars = sVar6 - 1;
  }
  return;
}

Assistant:

static void shiftChar(void)
{
	if (lexerState->capturing) {
		if (lexerState->captureBuf) {
			if (lexerState->captureSize + 1 >= lexerState->captureCapacity)
				reallocCaptureBuf();
			// TODO: improve this?
			lexerState->captureBuf[lexerState->captureSize] = peek();
		}
		lexerState->captureSize++;
	}

	lexerState->macroArgScanDistance--;

restart:
	if (lexerState->expansions) {
		// Advance within the current expansion
		assert(lexerState->expansions->offset <= lexerState->expansions->size);
		lexerState->expansions->offset++;
		if (lexerState->expansions->offset > lexerState->expansions->size) {
			// When advancing would go past an expansion's end, free it,
			// move up to its parent, and try again to advance
			struct Expansion *exp = lexerState->expansions;

			lexerState->expansions = lexerState->expansions->parent;
			freeExpansion(exp);
			goto restart;
		}
	} else {
		// Advance within the file contents
		lexerState->colNo++;
		if (lexerState->isMmapped) {
			lexerState->offset++;
		} else {
			assert(lexerState->index < LEXER_BUF_SIZE);
			lexerState->index++;
			if (lexerState->index == LEXER_BUF_SIZE)
				lexerState->index = 0; // Wrap around if necessary
			assert(lexerState->nbChars > 0);
			lexerState->nbChars--;
		}
	}
}